

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  iterator __begin2;
  iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_50;
  iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_38;
  
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_004d6990;
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    local_50.m_ = &(this->map_).elements_;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::SearchFrom(&local_50,(this->map_).elements_.index_of_first_non_null_);
    local_38.bucket_index_ = local_50.bucket_index_;
    local_38.node_ = local_50.node_;
    local_38.m_ = local_50.m_;
    while (local_38.node_ != (Node *)0x0) {
      MapValueRef::DeleteData((MapValueRef *)&(local_38.node_)->field_0x28);
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
      ::operator++(&local_38);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::clear
              (&(this->map_).elements_);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::~InnerMap
            (&(this->map_).elements_);
  MapFieldBase::~MapFieldBase((MapFieldBase *)this);
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  if (arena_ != nullptr) return;
  // DynamicMapField owns map values. Need to delete them before clearing the
  // map.
  for (auto& kv : map_) {
    kv.second.DeleteData();
  }
  map_.clear();
}